

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O2

int stb__stb_idict_addset(stb_idict *a,stb_int32 k,stb_int32 v,int allow_new,int allow_old,int copy)

{
  int iVar1;
  stb__stb_idict__hashpair *psVar2;
  uint uVar3;
  uint uVar4;
  uint uVar6;
  bool bVar7;
  ulong uVar5;
  
  uVar3 = stb_hashptr((void *)(ulong)(uint)k);
  if (k == 3) {
    bVar7 = a->has_del == '\0';
    if (bVar7) {
      if (allow_new != 0) goto LAB_0014eca9;
    }
    else if (allow_old != 0) {
LAB_0014eca9:
      a->dv = v;
      a->has_del = '\x01';
      goto LAB_0014ed42;
    }
LAB_0014ed2d:
    bVar7 = false;
    goto LAB_0014ed42;
  }
  if (k == 1) {
    bVar7 = a->has_empty == '\0';
    if (bVar7) {
      if (allow_new != 0) goto LAB_0014ec94;
    }
    else if (allow_old != 0) {
LAB_0014ec94:
      a->ev = v;
      a->has_empty = '\x01';
      goto LAB_0014ed42;
    }
    goto LAB_0014ed2d;
  }
  uVar4 = a->mask & uVar3;
  uVar5 = (ulong)uVar4;
  psVar2 = a->table;
  iVar1 = psVar2[uVar4].k;
  if (iVar1 == 1) {
    if (allow_new != 0) {
LAB_0014ed02:
      psVar2[(int)uVar4].k = k;
      psVar2[(int)uVar4].v = v;
      iVar1 = a->count;
      a->count = iVar1 + 1;
      bVar7 = true;
      if (a->grow_threshhold <= iVar1) {
        stb__stb_idict_rehash(a,a->limit * 2);
      }
      goto LAB_0014ed42;
    }
    goto LAB_0014ed2d;
  }
  if (iVar1 == 3) {
LAB_0014ecbf:
    uVar6 = uVar4;
    do {
      while( true ) {
        uVar4 = (int)uVar5 + ((uVar3 >> 0x13) + (uVar3 >> 6) + uVar3 | 1) & a->mask;
        uVar5 = (ulong)uVar4;
        iVar1 = psVar2[uVar5].k;
        if (iVar1 == 1) {
          if (allow_new == 0) goto LAB_0014ed2d;
          if (-1 < (int)uVar6) {
            a->deleted = a->deleted + -1;
            uVar4 = uVar6;
          }
          goto LAB_0014ed02;
        }
        if (iVar1 != 3) break;
        if ((int)uVar6 < 0) {
          uVar6 = uVar4;
        }
      }
    } while (iVar1 != k);
    if (allow_old != 0) {
      psVar2[uVar5].v = v;
    }
  }
  else {
    if (iVar1 != k) {
      uVar4 = 0xffffffff;
      goto LAB_0014ecbf;
    }
    if (allow_old != 0) {
      psVar2[uVar4].v = v;
    }
  }
  bVar7 = allow_new == 0;
LAB_0014ed42:
  return (int)bVar7;
}

Assistant:

stb_define_hash_base(STB_noprefix, stb_idict, short type; short gc; STB_nofields, stb_idict_,stb_idict_,0.85f,
              stb_int32,STB_IEMPTY,STB_IDEL,STB_nocopy,STB_nodelete,STB_nosafe,
              STB_equal,STB_equal,
              return stb_rehash_improved(k);,stb_int32,STB_nonullvalue,0)

stb_idict * stb_idict_new_size(int size)
{
   stb_idict *e = (stb_idict *) malloc(sizeof(*e));
   if (e) {
      if (!stb_is_pow2(size))
         size = 1 << stb_log2_ceil(size);
      stb_idict_init(e, size);
      e->alloced = 1;
   }
   return e;
}